

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# to_string_converters.h
# Opt level: O2

string * __thiscall
common::vector_to_string_abi_cxx11_
          (string *__return_storage_ptr__,common *this,
          vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *v)

{
  int __val;
  int *piVar1;
  int *piVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"{",(allocator<char> *)&local_90);
  piVar1 = *(int **)(this + 8);
  for (piVar2 = *(int **)this; piVar2 != piVar1; piVar2 = piVar2 + 2) {
    __val = piVar2[1];
    std::__cxx11::to_string(&local_50,*piVar2);
    std::operator+(&local_d0,"(",&local_50);
    std::operator+(&local_f0,&local_d0,",");
    std::__cxx11::to_string(&local_70,__val);
    std::operator+(&local_b0,&local_f0,&local_70);
    std::operator+(&local_90,&local_b0,"),");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_50);
  }
  if (1 < __return_storage_ptr__->_M_string_length) {
    std::__cxx11::string::pop_back();
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

const std::string vector_to_string(const std::vector<std::pair<int, int>>& v) {
  std::string s("{");
  for (auto e : v) {
    s += "(" + std::to_string(e.first) + "," + std::to_string(e.second) + "),";
  }
  if (s.size() > 1) s.pop_back();
  s += "}";
  return s;
}